

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

void __thiscall
optimization::inlineFunc::Rewriter::Rewriter
          (Rewriter *this,MirFunction *func,MirFunction *subfunc,CallInst *callInst,int cur_blkId)

{
  mapped_type mVar1;
  uint32_t uVar2;
  bool bVar3;
  int iVar4;
  pointer ppVar5;
  pointer ppVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  int *piVar10;
  mapped_type *pmVar11;
  uint32_t *puVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  size_type sVar15;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  long in_RCX;
  int __c;
  MirFunction *in_RDX;
  MirFunction *in_RSI;
  char *pcVar16;
  Rewriter *in_RDI;
  int in_R8D;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_Variable>_>::value,_pair<iterator,_bool>_>
  _Var17;
  iterator iter;
  int new_id_1;
  iterator iter_2;
  uint32_t new_id;
  iterator iter_1;
  VarId destId;
  int ret;
  VarId para_varId;
  VarId destId_1;
  int imm;
  int para;
  int i;
  iterator label_end_iter;
  iterator var_end_iter;
  Rewriter *in_stack_fffffffffffffce8;
  Variable *in_stack_fffffffffffffcf0;
  pair<unsigned_int,_mir::inst::Variable> *in_stack_fffffffffffffcf8;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_fffffffffffffd00;
  key_type_conflict *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  key_type_conflict *in_stack_fffffffffffffd28;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__k;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  VarId *in_stack_fffffffffffffd50;
  VarId *in_stack_fffffffffffffd58;
  _Self local_160;
  _Self local_158;
  _Base_ptr local_150;
  undefined1 local_148;
  uint local_114;
  mapped_type local_108;
  mapped_type local_100;
  uint local_fc;
  _Self local_f8;
  _Self local_f0 [3];
  undefined4 local_d8;
  undefined4 local_d4;
  mapped_type local_c8;
  undefined4 local_bc;
  mapped_type local_b0;
  uint32_t local_94;
  uint32_t local_90;
  int local_8c;
  VarId local_88 [2];
  int local_64;
  int local_60;
  int local_5c;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  _Base_ptr local_30;
  int local_24;
  long local_20;
  
  in_RDI->func = in_RSI;
  in_RDI->subfunc = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156f47)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156f60)
  ;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)0x156f79);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)0x156f95);
  in_RDI->cur_blkId = local_24;
  in_RDI->Inline_Var_Priority = 0;
  local_30 = (_Base_ptr)
             std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)in_stack_fffffffffffffce8);
  local_38 = (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator--
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                        in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
  while (ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
                  operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>
                              *)0x156ff1), 1000000 < ppVar5->first) {
    local_40 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
               operator--((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                          in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20))
    ;
  }
  ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                      0x15701f);
  in_RDI->varId = ppVar5->first;
  local_48 = (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffffce8);
  local_50 = (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                        in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
  local_58 = (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                        in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
  ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x157086);
  in_RDI->labelId = ppVar6->first;
  for (local_5c = 0; uVar7 = (ulong)local_5c,
      sVar8 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                        ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                         (local_20 + 0x38)), uVar7 < sVar8; local_5c = local_5c + 1) {
    local_60 = local_5c + 1;
    pcVar16 = (char *)(long)local_5c;
    pvVar9 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                       ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                        (local_20 + 0x38),(size_type)pcVar16);
    pcVar16 = std::variant<int,_mir::inst::VarId>::index
                        ((variant<int,_mir::inst::VarId> *)&pvVar9->field_0x8,pcVar16,__c);
    if (pcVar16 == (char *)0x0) {
      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)(local_20 + 0x38),
                 (long)local_5c);
      piVar10 = std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x15713e);
      local_64 = *piVar10;
      get_new_varId(in_stack_fffffffffffffce8);
      local_8c = local_60;
      std::
      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
           in_stack_fffffffffffffd08);
      local_90 = mir::inst::VarId::operator_cast_to_unsigned_int(local_88);
      std::
      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::operator[](in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      mir::inst::Variable::operator=
                (in_stack_fffffffffffffcf0,(Variable *)in_stack_fffffffffffffce8);
      iVar4 = in_RDI->Inline_Var_Priority;
      local_94 = mir::inst::VarId::operator_cast_to_unsigned_int(local_88);
      pmVar11 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[](in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      pmVar11->priority = iVar4;
      std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int&>
                ((VarId *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffffd00,
                 (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                 in_stack_fffffffffffffcf8);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)in_stack_fffffffffffffcf0,(value_type *)in_stack_fffffffffffffce8);
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffffd00);
      std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
      ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                  in_stack_fffffffffffffcf0);
      uVar2 = local_88[0].id;
      puVar12 = (uint32_t *)
                std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
      *puVar12 = uVar2;
    }
    else {
      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)(local_20 + 0x38),
                 (long)local_5c);
      std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x1573a4);
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffcf0,(VarId *)in_stack_fffffffffffffce8)
      ;
      mVar1 = local_b0;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
      *pmVar13 = mVar1;
    }
  }
  local_bc = 0;
  get_new_varId(in_stack_fffffffffffffce8);
  pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
  *pmVar13 = local_c8;
  local_d4 = local_bc;
  sVar14 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::count(in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->first);
  if (sVar14 == 0) {
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08)
    ;
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::operator[](in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    mir::inst::Variable::operator=(in_stack_fffffffffffffcf0,(Variable *)in_stack_fffffffffffffce8);
  }
  else {
    local_d8 = local_bc;
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08)
    ;
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::operator[](in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    mir::inst::Variable::operator=(in_stack_fffffffffffffcf0,(Variable *)in_stack_fffffffffffffce8);
  }
  std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
  unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffffd00,
             (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
             in_stack_fffffffffffffcf8);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)in_stack_fffffffffffffcf0,(value_type *)in_stack_fffffffffffffce8);
  std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffffd00);
  std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
             in_stack_fffffffffffffcf0);
  local_f0[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::begin((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)in_stack_fffffffffffffce8);
  while( true ) {
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
         ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)in_stack_fffffffffffffce8);
    bVar3 = std::operator!=(local_f0,&local_f8);
    if (!bVar3) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                        0x157682);
    local_fc = ppVar5->first;
    sVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffd00,(key_type *)in_stack_fffffffffffffcf8);
    if (sVar15 == 0) {
      get_new_varId(in_stack_fffffffffffffce8);
      mVar1 = local_108;
      local_100 = local_108;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                          0x157718);
      local_114 = ppVar5->first;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
      *pmVar13 = mVar1;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)0x157780)
      ;
      std::
      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
           in_stack_fffffffffffffd08);
      std::make_pair<unsigned_int&,mir::inst::Variable&>
                (&in_stack_fffffffffffffcf8->first,in_stack_fffffffffffffcf0);
      _Var17 = std::
               map<unsigned_int,mir::inst::Variable,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
               ::insert<std::pair<unsigned_int,mir::inst::Variable>>
                         (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_150 = (_Base_ptr)_Var17.first._M_node;
      local_148 = _Var17.second;
      std::pair<unsigned_int,_mir::inst::Variable>::~pair
                ((pair<unsigned_int,_mir::inst::Variable> *)0x1577f8);
      iVar4 = in_RDI->Inline_Var_Priority;
      pmVar11 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[](in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      pmVar11->priority = iVar4;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
               in_stack_fffffffffffffcf0);
  }
  local_158._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffce8);
  while( true ) {
    local_160._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffce8);
    bVar3 = std::operator!=(&local_158,&local_160);
    if (!bVar3) break;
    iVar4 = get_new_labelId(in_RDI);
    __k = &in_RDI->label_cast_map;
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x157931);
    this_00 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)in_stack_fffffffffffffd00,(key_type *)in_stack_fffffffffffffcf8);
    if (this_00 == (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x0
       ) {
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x157979);
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](this_00,(key_type *)__k);
      *pmVar13 = iVar4;
      in_stack_fffffffffffffd14 = iVar4;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffcf0);
  }
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         *)in_stack_fffffffffffffce8);
  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
             in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           *)in_stack_fffffffffffffce8);
  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x157a16);
  pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       (key_type *)in_stack_fffffffffffffd08);
  in_RDI->sub_starttId = *pmVar13;
  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x157a55);
  pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),pmVar13);
  in_RDI->sub_endId = *pmVar13;
  return;
}

Assistant:

Rewriter(mir::inst::MirFunction& func, mir::inst::MirFunction& subfunc,
           mir::inst::CallInst& callInst, int cur_blkId)
      : func(func), subfunc(subfunc), cur_blkId(cur_blkId) {
    auto var_end_iter = func.variables.end();
    var_end_iter--;
    while (var_end_iter->first > 1000000) {
      var_end_iter--;
    }
    varId = var_end_iter->first;
    auto label_end_iter = func.basic_blks.end();
    label_end_iter--;
    label_end_iter--;
    labelId = label_end_iter->first;
    for (int i = 0; i < callInst.params.size(); i++) {
      int para = i + 1;
      if (callInst.params[i].index() == 0) {
        auto imm = std::get<int>(callInst.params[i]);
        auto destId = get_new_varId();
        func.variables[destId] = subfunc.variables.at(para);
        func.variables[destId].priority = Inline_Var_Priority;
        init_inst_before.push_back(
            std::make_unique<mir::inst::AssignInst>(destId, imm));
        var_cast_map[para] = destId.id;
      } else {
        auto para_varId = std::get<mir::inst::VarId>(callInst.params[i]);
        var_cast_map[para] = para_varId.id;
      }
    }
    int ret = 0;
    auto destId = get_new_varId();
    var_cast_map[ret] = destId.id;
    if (subfunc.variables.count(ret)) {
      func.variables[destId.id] = subfunc.variables.at(ret);
    } else {
      func.variables[destId.id] = func.variables.at(callInst.dest.id);
    }
    init_inst_after.push_back(
        std::make_unique<mir::inst::AssignInst>(callInst.dest, destId));
    for (auto iter = subfunc.variables.begin(); iter != subfunc.variables.end();
         ++iter) {
      if (!var_cast_map.count(iter->first)) {
        auto new_id = get_new_varId().id;
        var_cast_map[iter->first] = new_id;
        func.variables.insert(
            std::make_pair(new_id, subfunc.variables.at(iter->first)));
        func.variables[new_id].priority = Inline_Var_Priority;
      }
    }
    for (auto iter = subfunc.basic_blks.begin();
         iter != subfunc.basic_blks.end(); ++iter) {
      int new_id;

      new_id = get_new_labelId();
      if (!label_cast_map.count(iter->first)) {
        label_cast_map[iter->first] = new_id;
      }
    }
    auto iter = subfunc.basic_blks.end();
    iter--;
    sub_starttId = label_cast_map.at(subfunc.basic_blks.begin()->first);
    sub_endId = label_cast_map.at(iter->first);
  }